

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O1

parser_error parse_player_timed_message_type(parser *p)

{
  uint uVar1;
  parser_error pVar2;
  long *plVar3;
  char *name;
  
  plVar3 = (long *)parser_priv(p);
  if (plVar3 != (long *)0x0) {
    if (*plVar3 == 0) {
      pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      name = parser_getsym(p,"type");
      uVar1 = message_lookup_by_name(name);
      *(uint *)(*plVar3 + 0x30) = uVar1;
      pVar2 = uVar1 >> 0x1b & ~PARSE_ERROR_INVALID_LIGHTING;
    }
    return pVar2;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                ,0xac,"enum parser_error parse_player_timed_message_type(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_message_type(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	ps->t->msgt = message_lookup_by_name(parser_getsym(p, "type"));
	return ps->t->msgt < 0 ?
		PARSE_ERROR_INVALID_MESSAGE : PARSE_ERROR_NONE;
}